

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

bool __thiscall senjo::GoCommandHandle::Parse(GoCommandHandle *this,char *params)

{
  size_type __n;
  size_type __n_00;
  size_type __n_01;
  GoCommandHandle *pGVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Output *this_00;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  bool invalid;
  bool local_b9;
  char *local_b8;
  GoCommandHandle *local_b0;
  uint64_t *local_a8;
  int *local_a0;
  int *local_98;
  Output local_90;
  long local_88;
  _func_int *local_80 [2];
  Output local_70;
  uint64_t *local_68;
  uint64_t *local_60;
  uint64_t *local_58;
  uint64_t *local_50;
  long local_48;
  long local_40;
  uint64_t *local_38;
  
  local_b8 = params;
  if ((Parse(char_const*)::argBinc_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argBinc_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argBinc_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argBinc_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argBinc_abi_cxx11_,"binc","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argBinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argBtime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argBtime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argBtime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argBtime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argBtime_abi_cxx11_,"btime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argBtime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argDepth_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argInfinite_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argInfinite_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argInfinite_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argInfinite_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argInfinite_abi_cxx11_,"infinite","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argInfinite_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argInfinite_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovestogo_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argMovestogo_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argMovestogo_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argMovestogo_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argMovestogo_abi_cxx11_,"movestogo","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovestogo_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovestogo_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovetime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argMovetime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argMovetime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argMovetime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argMovetime_abi_cxx11_,"movetime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovetime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovetime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNodes_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argNodes_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argNodes_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argNodes_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argNodes_abi_cxx11_,"nodes","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNodes_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNodes_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPonder_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argPonder_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argPonder_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argPonder_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argPonder_abi_cxx11_,"ponder","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPonder_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPonder_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSearchmoves_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argSearchmoves_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argSearchmoves_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argSearchmoves_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argSearchmoves_abi_cxx11_,"searchmoves","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSearchmoves_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argSearchmoves_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWinc_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argWinc_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argWinc_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argWinc_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argWinc_abi_cxx11_,"winc","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argWinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWtime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argWtime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argWtime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argWtime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argWtime_abi_cxx11_,"wtime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argWtime_abi_cxx11_);
  }
  this->infinite = false;
  this->ponder = false;
  local_98 = &this->depth;
  this->depth = 0;
  this->movestogo = 0;
  local_a0 = &this->movestogo;
  local_a8 = &this->binc;
  this->binc = 0;
  this->btime = 0;
  this->movetime = 0;
  this->nodes = 0;
  this->winc = 0;
  this->wtime = 0;
  __n_01 = Parse(char_const*)::argSearchmoves_abi_cxx11_._M_string_length;
  __n_00 = Parse(char_const*)::argPonder_abi_cxx11_._M_string_length;
  __n = Parse(char_const*)::argInfinite_abi_cxx11_._M_string_length;
  local_b9 = false;
  if (local_b8 != (char *)0x0) {
    local_38 = &this->btime;
    local_50 = &this->movetime;
    local_58 = &this->nodes;
    local_60 = &this->winc;
    local_68 = &this->wtime;
    local_40 = Parse(char_const*)::argInfinite_abi_cxx11_._M_string_length + 1;
    local_48 = Parse(char_const*)::argPonder_abi_cxx11_._M_string_length + 1;
    local_b0 = this;
    do {
      bVar5 = local_b9;
      cVar3 = *local_b8;
      pcVar6 = local_b8;
      if (cVar3 != '\0') {
        pcVar6 = local_b8 + 1;
        do {
          pcVar7 = pcVar6;
          iVar4 = isspace((int)cVar3);
          pcVar6 = pcVar7;
          if (iVar4 == 0) break;
          cVar3 = *pcVar7;
          pcVar6 = pcVar7 + 1;
          local_b8 = pcVar7;
        } while (cVar3 != '\0');
        pcVar6 = pcVar6 + -1;
      }
      pcVar7 = local_b8;
      if (*pcVar6 == '\0') goto LAB_0014124c;
      if ((((__n_01 != 0) && (local_b8 != (char *)0x0)) &&
          (iVar4 = strncmp(local_b8,Parse(char_const*)::argSearchmoves_abi_cxx11_._M_dataplus._M_p,
                           __n_01), iVar4 == 0)) &&
         ((pcVar7[__n_01] == '\0' || (iVar4 = isspace((int)pcVar7[__n_01]), iVar4 != 0)))) {
        cVar3 = pcVar7[__n_01];
        local_b8 = pcVar7 + __n_01;
        goto joined_r0x001411f8;
      }
      pcVar6 = local_b8;
      if (((__n == 0) || (local_b8 == (char *)0x0)) ||
         ((iVar4 = strncmp(local_b8,Parse(char_const*)::argInfinite_abi_cxx11_._M_dataplus._M_p,__n)
          , iVar4 != 0 || ((pcVar6[__n] != '\0' && (iVar4 = isspace((int)pcVar6[__n]), iVar4 == 0)))
          ))) {
        pcVar6 = local_b8;
        if (((__n_00 == 0) ||
            ((local_b8 == (char *)0x0 ||
             (iVar4 = strncmp(local_b8,Parse(char_const*)::argPonder_abi_cxx11_._M_dataplus._M_p,
                              __n_00), iVar4 != 0)))) ||
           ((pcVar6[__n_00] != '\0' && (iVar4 = isspace((int)pcVar6[__n_00]), iVar4 == 0)))) {
          bVar2 = NumberParam<int>(&Parse(char_const*)::argDepth_abi_cxx11_,local_98,&local_b8,
                                   &local_b9);
          if (((((!bVar2) &&
                (bVar2 = NumberParam<int>(&Parse(char_const*)::argMovestogo_abi_cxx11_,local_a0,
                                          &local_b8,&local_b9), !bVar2)) &&
               (bVar2 = NumberParam<unsigned_long>
                                  (&Parse(char_const*)::argBinc_abi_cxx11_,local_a8,&local_b8,
                                   &local_b9), !bVar2)) &&
              (((bVar2 = NumberParam<unsigned_long>
                                   (&Parse(char_const*)::argBtime_abi_cxx11_,local_38,&local_b8,
                                    &local_b9), !bVar2 &&
                (bVar2 = NumberParam<unsigned_long>
                                   (&Parse(char_const*)::argMovetime_abi_cxx11_,local_50,&local_b8,
                                    &local_b9), !bVar2)) &&
               (bVar2 = NumberParam<unsigned_long>
                                  (&Parse(char_const*)::argNodes_abi_cxx11_,local_58,&local_b8,
                                   &local_b9), !bVar2)))) &&
             ((bVar2 = NumberParam<unsigned_long>
                                 (&Parse(char_const*)::argWinc_abi_cxx11_,local_60,&local_b8,
                                  &local_b9), !bVar2 &&
              (bVar2 = NumberParam<unsigned_long>
                                 (&Parse(char_const*)::argWtime_abi_cxx11_,local_68,&local_b8,
                                  &local_b9), !bVar2)))) {
            Output::Output(&local_90,InfoPrefix);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Unexpected token: ",0x12);
            Output::operator<<(&local_90,&local_b8);
            this_00 = &local_90;
            goto LAB_001412ba;
          }
        }
        else {
          local_b8 = pcVar6 + __n_00;
          cVar3 = *local_b8;
          if (cVar3 != '\0') {
            pcVar6 = pcVar6 + local_48;
            do {
              pcVar7 = pcVar6;
              iVar4 = isspace((int)cVar3);
              if (iVar4 == 0) break;
              cVar3 = *pcVar7;
              pcVar6 = pcVar7 + 1;
              local_b8 = pcVar7;
            } while (cVar3 != '\0');
          }
          local_b0->ponder = true;
        }
      }
      else {
        local_b8 = pcVar6 + __n;
        cVar3 = *local_b8;
        if (cVar3 != '\0') {
          pcVar6 = pcVar6 + local_40;
          do {
            pcVar7 = pcVar6;
            iVar4 = isspace((int)cVar3);
            if (iVar4 == 0) break;
            cVar3 = *pcVar7;
            pcVar6 = pcVar7 + 1;
            local_b8 = pcVar7;
          } while (cVar3 != '\0');
        }
        local_b0->infinite = true;
      }
      bVar5 = local_b9;
      if ((local_b9 != false) || (local_b8 == (char *)0x0)) goto LAB_0014124c;
    } while( true );
  }
LAB_001412c3:
  if ((this->infinite != false) || (this->ponder == true)) {
    *local_98 = 0;
    *local_a0 = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    *local_a8 = 0;
    local_a8[1] = 0;
  }
  return true;
joined_r0x001411f8:
  if (cVar3 == '\0') goto LAB_0014121b;
  pcVar6 = local_b8 + 1;
  iVar4 = isspace((int)cVar3);
  if (iVar4 == 0) goto LAB_0014121b;
  cVar3 = *pcVar6;
  local_b8 = pcVar6;
  goto joined_r0x001411f8;
LAB_0014121b:
  Output::Output(&local_90,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"searchmoves not implemented!",0x1c);
  Output::~Output(&local_90);
LAB_0014124c:
  pGVar1 = local_b0;
  this = local_b0;
  if ((bVar5 & 1) != 0) {
    Output::Output(&local_70,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    (*(pGVar1->super_BackgroundCommand)._vptr_BackgroundCommand[3])(&local_90,pGVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_90._vptr_Output,local_88);
    if (local_90._vptr_Output != local_80) {
      operator_delete(local_90._vptr_Output);
    }
    this_00 = &local_70;
LAB_001412ba:
    Output::~Output(this_00);
    return false;
  }
  goto LAB_001412c3;
}

Assistant:

bool GoCommandHandle::Parse(const char* params)
{
  static const std::string argBinc        = "binc";
  static const std::string argBtime       = "btime";
  static const std::string argDepth       = "depth";
  static const std::string argInfinite    = "infinite";
  static const std::string argMovestogo   = "movestogo";
  static const std::string argMovetime    = "movetime";
  static const std::string argNodes       = "nodes";
  static const std::string argPonder      = "ponder";
  static const std::string argSearchmoves = "searchmoves";
  static const std::string argWinc        = "winc";
  static const std::string argWtime       = "wtime";

  infinite  = false;
  ponder    = false;
  depth     = 0;
  movestogo = 0;
  binc      = 0;
  btime     = 0;
  movetime  = 0;
  nodes     = 0;
  winc      = 0;
  wtime     = 0;

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (ParamMatch(argSearchmoves, params)) {
      Output() << "searchmoves not implemented!"; // TODO
      break;
    }
    if (HasParam(argInfinite,     infinite,  params) ||
        HasParam(argPonder,       ponder,    params) ||
        NumberParam(argDepth,     depth,     params, invalid) ||
        NumberParam(argMovestogo, movestogo, params, invalid) ||
        NumberParam(argBinc,      binc,      params, invalid) ||
        NumberParam(argBtime,     btime,     params, invalid) ||
        NumberParam(argMovetime,  movetime,  params, invalid) ||
        NumberParam(argNodes,     nodes,     params, invalid) ||
        NumberParam(argWinc,      winc,      params, invalid) ||
        NumberParam(argWtime,     wtime,     params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (infinite || ponder) {
    depth     = 0;
    movestogo = 0;
    binc      = 0;
    btime     = 0;
    movetime  = 0;
    nodes     = 0;
    winc      = 0;
    wtime     = 0;
  }

  return true;
}